

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void t1_encode_cblks(opj_t1_t *t1,opj_tcd_tile_t *tile,opj_tcp_t *tcp)

{
  opj_tcd_band_t *poVar1;
  byte *pbVar2;
  float fVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  OPJ_UINT32 OVar7;
  uint uVar8;
  opj_tcd_tilecomp_t *poVar9;
  opj_tccp_t *poVar10;
  opj_tcd_resolution_t *poVar11;
  opj_tcd_precinct_t *poVar12;
  opj_tcd_cblk_enc_t *poVar13;
  int *piVar14;
  opj_mqc_t *mqc;
  flag_t *pfVar15;
  opj_mqc_t *poVar16;
  opj_mqc_t *mqc_00;
  uint uVar17;
  byte bVar18;
  opj_bool oVar19;
  int level;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  byte bVar25;
  undefined8 uVar26;
  short *psVar27;
  long lVar28;
  uint *puVar29;
  long lVar30;
  byte bVar31;
  uint uVar32;
  ulong uVar33;
  opj_tcd_pass_t *poVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  ulong uVar43;
  ushort uVar44;
  int *piVar45;
  long lVar46;
  long lVar47;
  ushort uVar48;
  ulong uVar49;
  uint uVar50;
  opj_tcd_cblk_enc_t *poVar51;
  int *piVar52;
  ulong uVar53;
  ulong uVar54;
  int iVar55;
  int iVar56;
  ushort *flagsp;
  long lVar57;
  uint uVar58;
  bool bVar59;
  bool bVar60;
  float fVar61;
  double dVar62;
  undefined1 auVar63 [16];
  int local_1ac;
  int local_198;
  int local_194;
  double local_190;
  double local_c8;
  long local_b8;
  long local_a8;
  
  tile->distotile = 0.0;
  lVar30 = 0;
  do {
    if (tile->numcomps <= lVar30) {
      return;
    }
    poVar9 = tile->comps;
    poVar10 = tcp->tccps;
    iVar5 = poVar9[lVar30].x1;
    iVar6 = poVar9[lVar30].x0;
    for (lVar36 = 0; lVar36 < poVar9[lVar30].numresolutions; lVar36 = lVar36 + 1) {
      poVar11 = poVar9[lVar30].resolutions;
      for (lVar47 = 0; lVar47 < poVar11[lVar36].numbands; lVar47 = lVar47 + 1) {
        poVar1 = poVar11[lVar36].bands + lVar47;
        fVar61 = floorf(poVar11[lVar36].bands[lVar47].stepsize * 8192.0);
        for (lVar35 = 0; lVar35 < (long)poVar11[lVar36].ph * (long)poVar11[lVar36].pw;
            lVar35 = lVar35 + 1) {
          poVar12 = poVar1->precincts;
          for (lVar46 = 0; lVar46 < (long)poVar12[lVar35].ch * (long)poVar12[lVar35].cw;
              lVar46 = lVar46 + 1) {
            poVar13 = poVar12[lVar35].cblks.enc;
            iVar37 = poVar13[lVar46].x0 - poVar1->x0;
            if ((poVar1->bandno & 1U) != 0) {
              iVar37 = (iVar37 + poVar9[lVar30].resolutions[lVar36 + -1].x1) -
                       poVar9[lVar30].resolutions[lVar36 + -1].x0;
            }
            iVar40 = poVar13[lVar46].y0 - poVar1->y0;
            if ((poVar1->bandno & 2U) != 0) {
              iVar40 = (iVar40 + poVar9[lVar30].resolutions[lVar36 + -1].y1) -
                       poVar9[lVar30].resolutions[lVar36 + -1].y0;
            }
            poVar51 = poVar13 + lVar46;
            oVar19 = allocate_buffers(t1,poVar51->x1 - poVar13[lVar46].x0,
                                      poVar51->y1 - poVar13[lVar46].y0);
            if (oVar19 == 0) {
              return;
            }
            piVar14 = t1->data;
            uVar21 = t1->w;
            piVar45 = poVar9[lVar30].data + (iVar40 * (iVar5 - iVar6) + iVar37);
            uVar49 = 0;
            if (0 < (int)uVar21) {
              uVar49 = (ulong)uVar21;
            }
            uVar33 = (ulong)(uint)t1->h;
            if (t1->h < 1) {
              uVar33 = 0;
            }
            if (poVar10[lVar30].qmfbid == 1) {
              piVar52 = piVar14;
              for (uVar53 = 0; uVar53 != uVar33; uVar53 = uVar53 + 1) {
                for (uVar54 = 0; uVar49 != uVar54; uVar54 = uVar54 + 1) {
                  piVar52[uVar54] = piVar45[uVar54] << 6;
                }
                piVar52 = piVar52 + (int)uVar21;
                piVar45 = piVar45 + ((long)iVar5 - (long)iVar6);
              }
            }
            else {
              piVar52 = piVar14;
              for (uVar53 = 0; uVar53 != uVar33; uVar53 = uVar53 + 1) {
                for (uVar54 = 0; uVar49 != uVar54; uVar54 = uVar54 + 1) {
                  lVar38 = (long)piVar45[uVar54] * (long)(int)(0x4000000 / (long)(int)fVar61);
                  piVar52[uVar54] = (int)((ulong)((uint)lVar38 & 0x1000) + lVar38 >> 0xd) >> 5;
                }
                piVar52 = piVar52 + (int)uVar21;
                piVar45 = piVar45 + ((long)iVar5 - (long)iVar6);
              }
            }
            iVar37 = poVar1->bandno;
            uVar21 = poVar10[lVar30].cblksty;
            OVar7 = poVar10[lVar30].qmfbid;
            fVar3 = poVar1->stepsize;
            iVar40 = tile->numcomps;
            iVar55 = tcp->mct;
            mqc = t1->mqc;
            uVar32 = t1->h * t1->w;
            uVar33 = 0;
            uVar49 = (ulong)uVar32;
            if ((int)uVar32 < 1) {
              uVar49 = uVar33;
            }
            uVar32 = 0;
            for (; uVar49 != uVar33; uVar33 = uVar33 + 1) {
              uVar20 = piVar14[uVar33];
              uVar58 = -uVar20;
              if (0 < (int)uVar20) {
                uVar58 = uVar20;
              }
              if ((int)uVar32 <= (int)uVar58) {
                uVar32 = uVar58;
              }
            }
            if (uVar32 == 0) {
              local_1ac = 0;
            }
            else {
              local_1ac = -5;
              for (; 1 < (int)uVar32; uVar32 = uVar32 >> 1) {
                local_1ac = local_1ac + 1;
              }
            }
            level = poVar9[lVar30].numresolutions + ~(uint)lVar36;
            poVar51->numbps = local_1ac;
            local_1ac = local_1ac + -1;
            mqc_resetstates(mqc);
            mqc_setstate(mqc,0x12,0,0x2e);
            mqc_setstate(mqc,0x11,0,3);
            uVar26 = 0;
            mqc_setstate(mqc,0,0,4);
            mqc_init_enc(mqc,poVar51->data);
            auVar63._0_4_ = -(uint)((uVar21 & 2) == 0);
            auVar63._4_4_ = -(uint)((uVar21 & 1) == 0);
            auVar63._8_4_ = -(uint)((uVar21 & 4) == 0);
            auVar63._12_4_ = -(uint)((uVar21 & 0x20) == 0);
            bVar24 = iVar40 == 3 && iVar55 != 0;
            uVar32 = movmskps((int)CONCAT71((int7)((ulong)uVar26 >> 8),bVar24),auVar63);
            bVar18 = ((byte)uVar32 & 2) >> 1;
            local_c8 = 0.0;
            uVar49 = 0;
            local_198 = 2;
            while (-1 < local_1ac) {
              poVar34 = poVar51->passes + uVar49;
              bVar31 = (byte)uVar21 & 1;
              if (poVar51->numbps + -4 <= local_1ac) {
                bVar31 = 0;
              }
              if (1 < local_198) {
                bVar31 = 0;
              }
              bVar25 = (byte)local_1ac;
              if (local_198 == 2) {
                uVar20 = 0x40 << (bVar25 & 0x1f);
                poVar16 = t1->mqc;
                psVar27 = lut_nmsedec_sig;
                if (local_1ac == 0) {
                  psVar27 = lut_nmsedec_sig0;
                }
                local_a8 = 0;
                local_b8 = -3;
                local_194 = 0;
                uVar33 = 0;
LAB_001f4920:
                if ((long)uVar33 < (long)t1->h) {
                  iVar40 = (int)uVar33;
                  uVar53 = uVar33 | 3;
                  uVar54 = uVar33 | 1;
                  uVar22 = uVar33 | 2;
                  uVar33 = uVar33 + 4;
                  lVar38 = 0;
                  do {
                    lVar39 = lVar38 * 4;
                    do {
                      lVar57 = lVar38;
                      lVar23 = (long)t1->w;
                      if (lVar23 <= lVar57) {
                        local_a8 = local_a8 + 0x10;
                        local_b8 = local_b8 + -4;
                        goto LAB_001f4920;
                      }
                      uVar58 = 0;
                      bVar31 = 1;
                      if ((long)t1->h <= (long)uVar53) goto LAB_001f4b1b;
                      lVar28 = (long)t1->flags_stride;
                      lVar38 = lVar57 + 1;
                      pfVar15 = t1->flags;
                      if ((uVar21 & 8) == 0) {
                        if (((pfVar15[uVar54 * lVar28 + lVar57 + 1] & 0x50ffU) != 0) ||
                           ((pfVar15[uVar22 * lVar28 + lVar38] & 0x50ffU) != 0)) goto LAB_001f4b1b;
                        uVar48 = pfVar15[uVar53 * lVar28 + lVar38];
                        uVar44 = 0x50ff;
                      }
                      else {
                        if (((pfVar15[uVar54 * lVar28 + lVar57 + 1] & 0x50ffU) != 0) ||
                           ((pfVar15[uVar22 * lVar28 + lVar38] & 0x50ffU) != 0)) goto LAB_001f4b1b;
                        uVar48 = pfVar15[uVar53 * lVar28 + lVar38];
                        uVar44 = 0x50b9;
                      }
                      if (((uVar48 & 0x50ff) != 0) ||
                         ((pfVar15[lVar28 * uVar33 + lVar38] & uVar44) != 0)) goto LAB_001f4b1b;
                      puVar29 = (uint *)(local_a8 * lVar23 + lVar39 + (long)t1->data);
                      for (uVar43 = 0; uVar43 != 4; uVar43 = uVar43 + 1) {
                        uVar58 = *puVar29;
                        uVar50 = -uVar58;
                        if (0 < (int)uVar58) {
                          uVar50 = uVar58;
                        }
                        if ((uVar50 & uVar20) != 0) goto LAB_001f4aa7;
                        puVar29 = puVar29 + lVar23;
                      }
                      uVar43 = 4;
LAB_001f4aa7:
                      poVar16->curctx = poVar16->ctxs + 0x11;
                      uVar58 = (uint)uVar43;
                      mqc_encode(poVar16,(uint)(uVar58 != 4));
                      lVar39 = lVar39 + 4;
                    } while (uVar58 == 4);
                    poVar16->curctx = poVar16->ctxs + 0x12;
                    mqc_encode(poVar16,(uint)(uVar43 >> 1) & 0x7fffffff);
                    mqc_encode(poVar16,uVar58 & 1);
                    bVar31 = 0;
LAB_001f4b1b:
                    uVar58 = uVar58 + iVar40;
                    for (lVar38 = 0; uVar43 = lVar38 + (ulong)uVar58, uVar43 < uVar33;
                        lVar38 = lVar38 + 1) {
                      if (t1->h <= (int)uVar43) break;
                      bVar59 = true;
                      if ((uVar21 & 8) != 0) {
                        if (local_b8 + (ulong)uVar58 + lVar38 == 0) {
                          bVar59 = false;
                        }
                        else {
                          bVar59 = uVar43 != t1->h - 1;
                        }
                      }
                      lVar39 = (long)(int)((int)lVar38 + uVar58 + 1) * (long)t1->flags_stride;
                      pfVar15 = t1->flags;
                      flagsp = (ushort *)(pfVar15 + lVar57 + lVar39 + 1);
                      piVar14 = t1->data;
                      lVar23 = (long)(int)uVar43 * (long)t1->w;
                      mqc_00 = t1->mqc;
                      uVar48 = *flagsp;
                      uVar50 = uVar48 & 0xfffffbb9;
                      if (bVar59) {
                        uVar50 = (uint)uVar48;
                      }
                      if ((bool)(~bVar31 & lVar38 == 0)) {
LAB_001f4c70:
                        uVar8 = piVar14[lVar57 + lVar23];
                        uVar17 = -uVar8;
                        if (0 < (int)uVar8) {
                          uVar17 = uVar8;
                        }
                        local_194 = local_194 + psVar27[uVar17 >> (bVar25 & 0x1f) & 0x7f];
                        uVar50 = uVar50 >> 4 & 0xff;
                        mqc_00->curctx =
                             mqc_00->ctxs +
                             "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                             [uVar50];
                        mqc_encode(mqc_00,(int)""[uVar50] ^ uVar8 >> 0x1f);
                        t1_updateflags((flag_t *)flagsp,uVar8 >> 0x1f,t1->flags_stride);
                      }
                      else if ((uVar48 & 0x5000) == 0) {
                        mqc_00->curctx = mqc_00->ctxs + ""[(int)(uVar50 & 0xff | iVar37 << 8)];
                        uVar8 = piVar14[lVar57 + lVar23];
                        uVar17 = -uVar8;
                        if (0 < (int)uVar8) {
                          uVar17 = uVar8;
                        }
                        mqc_encode(mqc_00,(uint)((uVar20 & uVar17) != 0));
                        if ((uVar20 & uVar17) != 0) goto LAB_001f4c70;
                      }
                      pbVar2 = (byte *)((long)pfVar15 + lVar39 * 2 + lVar57 * 2 + 3);
                      *pbVar2 = *pbVar2 & 0xbf;
                    }
                    lVar38 = lVar57 + 1;
                  } while( true );
                }
                if ((byte)((byte)uVar32 >> 3) == 0) {
                  mqc_segmark_enc(mqc);
                }
              }
              else if (local_198 == 1) {
                psVar27 = lut_nmsedec_ref;
                if (local_1ac == 0) {
                  psVar27 = lut_nmsedec_ref0;
                }
                iVar55 = 0;
                local_194 = 0;
                for (iVar40 = 0; iVar40 < t1->h; iVar40 = iVar40 + 4) {
                  iVar56 = 0;
LAB_001f478b:
                  iVar42 = iVar40;
                  if (iVar56 < t1->w) {
                    do {
                      iVar42 = iVar42 + -1;
                      do {
                        iVar41 = iVar42;
                        if (iVar55 + iVar41 == 3) {
LAB_001f489b:
                          iVar56 = iVar56 + 1;
                          goto LAB_001f478b;
                        }
                        iVar42 = iVar41 + 1;
                        if (t1->h <= iVar42) goto LAB_001f489b;
                        bVar59 = true;
                        if ((uVar21 & 8) != 0) {
                          if (iVar55 + iVar41 == 2) {
                            bVar59 = false;
                          }
                          else {
                            bVar59 = iVar42 != t1->h + -1;
                          }
                        }
                        pfVar15 = t1->flags;
                        lVar38 = (long)((iVar41 + 2) * t1->flags_stride + iVar56);
                        uVar48 = pfVar15[lVar38 + 1];
                        uVar20 = uVar48 & 0xfffffbb9;
                        if (bVar59) {
                          uVar20 = (uint)uVar48;
                        }
                      } while ((uVar20 & 0x5000) != 0x1000);
                      uVar58 = t1->data[t1->w * iVar42 + iVar56];
                      uVar50 = -uVar58;
                      if (0 < (int)uVar58) {
                        uVar50 = uVar58;
                      }
                      uVar58 = (uint)((0x40 << (bVar25 & 0x1f) & uVar50) != 0);
                      poVar16 = t1->mqc;
                      uVar33 = (ulong)(0xf - ((char)uVar20 == '\0'));
                      if ((uVar20 >> 0xd & 1) != 0) {
                        uVar33 = 0x10;
                      }
                      sVar4 = psVar27[uVar50 >> (bVar25 & 0x1f) & 0x7f];
                      poVar16->curctx = poVar16->ctxs + uVar33;
                      if (bVar31 == 0) {
                        mqc_encode(poVar16,uVar58);
                      }
                      else {
                        mqc_bypass_enc(poVar16,uVar58);
                      }
                      local_194 = local_194 + sVar4;
                      pbVar2 = (byte *)((long)pfVar15 + lVar38 * 2 + 3);
                      *pbVar2 = *pbVar2 | 0x20;
                      iVar42 = iVar41 + 2;
                    } while( true );
                  }
                  iVar55 = iVar55 + -4;
                }
              }
              else {
                psVar27 = lut_nmsedec_sig;
                if (local_1ac == 0) {
                  psVar27 = lut_nmsedec_sig0;
                }
                iVar40 = 0;
                local_194 = 0;
                for (iVar55 = 0; iVar55 < t1->h; iVar55 = iVar55 + 4) {
                  iVar56 = 0;
LAB_001f4f26:
                  iVar42 = iVar55;
                  if (iVar56 < t1->w) {
                    do {
                      iVar42 = iVar42 + -1;
                      do {
                        iVar41 = iVar42;
                        if (iVar40 + iVar41 == 3) {
LAB_001f50fe:
                          iVar56 = iVar56 + 1;
                          goto LAB_001f4f26;
                        }
                        iVar42 = iVar41 + 1;
                        if (t1->h <= iVar42) goto LAB_001f50fe;
                        bVar59 = true;
                        if ((uVar21 & 8) != 0) {
                          if (iVar40 + iVar41 == 2) {
                            bVar59 = false;
                          }
                          else {
                            bVar59 = iVar42 != t1->h + -1;
                          }
                        }
                        pfVar15 = t1->flags;
                        lVar38 = (long)((iVar41 + 2) * t1->flags_stride + iVar56);
                        uVar48 = pfVar15[lVar38 + 1] & 0xfbb9;
                        if (bVar59) {
                          uVar48 = pfVar15[lVar38 + 1];
                        }
                      } while ((uVar48 & 0x5000) != 0 || (uVar48 & 0xff) == 0);
                      poVar16 = t1->mqc;
                      piVar14 = t1->data;
                      iVar42 = t1->w * iVar42 + iVar56;
                      uVar20 = piVar14[iVar42];
                      uVar58 = -uVar20;
                      if (0 < (int)uVar20) {
                        uVar58 = uVar20;
                      }
                      uVar58 = uVar58 & 0x40 << (bVar25 & 0x1f);
                      uVar20 = (uint)(uVar58 != 0);
                      poVar16->curctx = poVar16->ctxs + ""[(int)(uVar48 & 0xff | iVar37 << 8)];
                      if (bVar31 == 0) {
                        mqc_encode(poVar16,uVar20);
                      }
                      else {
                        mqc_bypass_enc(poVar16,uVar20);
                      }
                      if (uVar58 != 0) {
                        uVar20 = piVar14[iVar42];
                        uVar50 = uVar20 >> 0x1f;
                        uVar58 = -uVar20;
                        if (0 < (int)uVar20) {
                          uVar58 = uVar20;
                        }
                        sVar4 = psVar27[uVar58 >> (bVar25 & 0x1f) & 0x7f];
                        uVar33 = (ulong)(uVar48 >> 4) & 0xff;
                        poVar16->curctx =
                             poVar16->ctxs +
                             "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                             [uVar33];
                        if (bVar31 == 0) {
                          mqc_encode(poVar16,(int)""[uVar33] ^ uVar50);
                        }
                        else {
                          mqc_bypass_enc(poVar16,uVar50);
                        }
                        local_194 = local_194 + sVar4;
                        t1_updateflags(pfVar15 + lVar38 + 1,uVar50,t1->flags_stride);
                      }
                      pbVar2 = (byte *)((long)pfVar15 + lVar38 * 2 + 3);
                      *pbVar2 = *pbVar2 | 0x40;
                      iVar42 = iVar41 + 2;
                    } while( true );
                  }
                  iVar40 = iVar40 + -4;
                }
              }
              if (OVar7 == 1) {
                local_190 = 1.0;
                if (bVar24) {
                  local_190 = mct_getnorm((int)lVar30);
                }
                dVar62 = dwt_getnorm(level,iVar37);
              }
              else {
                local_190 = 1.0;
                if (bVar24) {
                  local_190 = mct_getnorm_real((int)lVar30);
                }
                dVar62 = dwt_getnorm_real(level,iVar37);
              }
              dVar62 = (double)(1 << (bVar25 & 0x1f)) * dVar62 * (double)fVar3 * local_190;
              dVar62 = dVar62 * dVar62 * (double)local_194 * 0.0001220703125;
              tile->distotile = tile->distotile + dVar62;
              if (((uVar32 & 4) == 0) && ((local_198 != 2 || (local_1ac != 0)))) {
LAB_001f4e57:
                mqc_flush(mqc);
                bVar59 = true;
                iVar56 = 1;
                iVar55 = iVar56;
              }
              else {
                iVar40 = poVar51->numbps + -4;
                if ((local_198 < 1) || (iVar40 <= local_1ac)) {
                  iVar56 = 0;
                  bVar59 = false;
                  iVar55 = 3;
                  if ((local_198 == 2 && iVar40 == local_1ac) && bVar18 == 0) goto LAB_001f4e57;
                }
                else {
                  iVar56 = 0;
                  bVar59 = false;
                  iVar55 = 3;
                  if (bVar18 == 0) goto LAB_001f4e57;
                }
              }
              poVar34->term = iVar56;
              local_198 = local_198 + 1;
              bVar60 = local_198 == 3;
              if (bVar60) {
                local_198 = 0;
              }
              local_1ac = local_1ac - (uint)bVar60;
              if ((bVar59) && (0 < local_1ac)) {
                if ((local_198 < 2 && bVar18 == 0) && local_1ac < poVar51->numbps + -4) {
                  mqc_bypass_init_enc(mqc);
                }
                else {
                  mqc_restart_init_enc(mqc);
                }
              }
              local_c8 = local_c8 + dVar62;
              poVar34->distortiondec = local_c8;
              iVar40 = mqc_numbytes(mqc);
              poVar34->rate = iVar40 + iVar55;
              if ((uVar32 & 1) == 0) {
                mqc_reset_enc(mqc);
              }
              uVar49 = uVar49 + 1;
            }
            if ((uVar21 & 0x10) == 0) {
              if (bVar18 != 0) {
                mqc_flush(mqc);
              }
            }
            else {
              mqc_erterm_enc(mqc);
            }
            poVar51->totalpasses = (int)uVar49;
            lVar38 = 0;
            for (lVar39 = 0; lVar39 < (int)uVar49; lVar39 = lVar39 + 1) {
              poVar34 = poVar51->passes;
              iVar37 = *(int *)((long)&poVar34->rate + lVar38);
              iVar40 = mqc_numbytes(mqc);
              if (iVar40 < iVar37) {
                uVar21 = mqc_numbytes(mqc);
                *(uint *)((long)&poVar34->rate + lVar38) = uVar21;
              }
              else {
                uVar21 = *(uint *)((long)&poVar34->rate + lVar38);
              }
              if ((1 < (int)uVar21) && (poVar51->data[(ulong)uVar21 - 1] == 0xff)) {
                uVar21 = uVar21 - 1;
                *(uint *)((long)&poVar34->rate + lVar38) = uVar21;
              }
              if (lVar38 == 0) {
                iVar37 = 0;
              }
              else {
                iVar37 = *(int *)((long)&poVar51->passes[-1].rate + lVar38);
              }
              *(uint *)((long)&poVar34->len + lVar38) = uVar21 - iVar37;
              uVar49 = (ulong)(uint)poVar51->totalpasses;
              lVar38 = lVar38 + 0x18;
            }
          }
        }
      }
    }
    lVar30 = lVar30 + 1;
  } while( true );
}

Assistant:

void t1_encode_cblks(
		opj_t1_t *t1,
		opj_tcd_tile_t *tile,
		opj_tcp_t *tcp)
{
	int compno, resno, bandno, precno, cblkno;

	tile->distotile = 0;		/* fixed_quality */

	for (compno = 0; compno < tile->numcomps; ++compno) {
		opj_tcd_tilecomp_t* tilec = &tile->comps[compno];
		opj_tccp_t* tccp = &tcp->tccps[compno];
		int tile_w = tilec->x1 - tilec->x0;

		for (resno = 0; resno < tilec->numresolutions; ++resno) {
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];

			for (bandno = 0; bandno < res->numbands; ++bandno) {
				opj_tcd_band_t* restrict band = &res->bands[bandno];
        int bandconst = 8192 * 8192 / ((int) floor(band->stepsize * 8192));

				for (precno = 0; precno < res->pw * res->ph; ++precno) {
					opj_tcd_precinct_t *prc = &band->precincts[precno];

					for (cblkno = 0; cblkno < prc->cw * prc->ch; ++cblkno) {
						opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
						int* restrict datap;
						int* restrict tiledp;
						int cblk_w;
						int cblk_h;
						int i, j;

						int x = cblk->x0 - band->x0;
						int y = cblk->y0 - band->y0;
						if (band->bandno & 1) {
							opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
							x += pres->x1 - pres->x0;
						}
						if (band->bandno & 2) {
							opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
							y += pres->y1 - pres->y0;
						}

						if(!allocate_buffers(
									t1,
									cblk->x1 - cblk->x0,
									cblk->y1 - cblk->y0))
						{
							return;
						}

						datap=t1->data;
						cblk_w = t1->w;
						cblk_h = t1->h;

						tiledp=&tilec->data[(y * tile_w) + x];
						if (tccp->qmfbid == 1) {
							for (j = 0; j < cblk_h; ++j) {
								for (i = 0; i < cblk_w; ++i) {
									int tmp = tiledp[(j * tile_w) + i];
									datap[(j * cblk_w) + i] = tmp << T1_NMSEDEC_FRACBITS;
								}
							}
						} else {		/* if (tccp->qmfbid == 0) */
							for (j = 0; j < cblk_h; ++j) {
								for (i = 0; i < cblk_w; ++i) {
									int tmp = tiledp[(j * tile_w) + i];
									datap[(j * cblk_w) + i] =
										fix_mul(
										tmp,
										bandconst) >> (11 - T1_NMSEDEC_FRACBITS);
								}
							}
						}

						t1_encode_cblk(
								t1,
								cblk,
								band->bandno,
								compno,
								tilec->numresolutions - 1 - resno,
								tccp->qmfbid,
								band->stepsize,
								tccp->cblksty,
								tile->numcomps,
								tcp->mct,
								tile);

					} /* cblkno */
				} /* precno */
			} /* bandno */
		} /* resno  */
	} /* compno  */
}